

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteList.c
# Opt level: O2

void Io_WriteList(Abc_Ntk_t *pNtk,char *pFileName,int fUseHost)

{
  FILE *__stream;
  char *pcVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Io_WriteList(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  fprintf(__stream,"# Adjacency list for sequential AIG \"%s\"\n",pNtk->pName);
  pcVar1 = Extra_TimeStamp();
  fprintf(__stream,"# written by ABC on %s\n",pcVar1);
  pAVar2 = Abc_AigConst1(pNtk);
  iVar3 = 0;
  if (0 < (pAVar2->vFanouts).nSize) {
    pAVar2 = Abc_AigConst1(pNtk);
    Io_WriteListEdge((FILE *)__stream,pAVar2);
    iVar3 = 0;
  }
  for (; iVar3 < pNtk->vPis->nSize; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkPi(pNtk,iVar3);
    Io_WriteListEdge((FILE *)__stream,pAVar2);
  }
  iVar3 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar3) {
      if (fUseHost == 0) {
        for (iVar3 = 0; iVar3 < pNtk->vPos->nSize; iVar3 = iVar3 + 1) {
          pAVar2 = Abc_NtkPo(pNtk,iVar3);
          Io_WriteListEdge((FILE *)__stream,pAVar2);
        }
      }
      else {
        for (iVar3 = 0; iVar3 < pNtk->vPos->nSize; iVar3 = iVar3 + 1) {
          pAVar2 = Abc_NtkPo(pNtk,iVar3);
          pcVar1 = Abc_ObjName(pAVar2);
          fprintf(__stream,"%-10s >    ",pcVar1);
          pcVar1 = Abc_ObjName(pAVar2);
          fprintf(__stream," %s ([%s_to_%s] = %d)","HOST",pcVar1,"HOST",0);
          fputc(0x2e,__stream);
          fputc(10,__stream);
        }
        fprintf(__stream,"%-10s >    ","HOST");
        for (iVar3 = 0; iVar3 < pNtk->vPis->nSize; iVar3 = iVar3 + 1) {
          pAVar2 = Abc_NtkPi(pNtk,iVar3);
          pcVar1 = Abc_ObjName(pAVar2);
          fprintf(__stream," %s",pcVar1);
          pcVar1 = Abc_ObjName(pAVar2);
          fprintf(__stream," ([%s_to_%s] = %d)","HOST",pcVar1,0);
          if (iVar3 != pNtk->vPis->nSize + -1) {
            fputc(0x2c,__stream);
          }
        }
        fputc(0x2e,__stream);
        fputc(10,__stream);
      }
      fputc(10,__stream);
      fclose(__stream);
      return;
    }
    pAVar2 = Abc_NtkObj(pNtk,iVar3);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      if (((ulong)pAVar2 & 1) != 0) {
        pcVar1 = "!Abc_ObjIsComplement(pNode)";
LAB_002ec780:
        __assert_fail(pcVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
      }
      if (pAVar2->pNtk->ntkType != ABC_NTK_STRASH) {
        pcVar1 = "Abc_NtkIsStrash(pNode->pNtk)";
        goto LAB_002ec780;
      }
      if ((pAVar2->vFanins).nSize == 2) {
        Io_WriteListEdge((FILE *)__stream,pAVar2);
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void Io_WriteList( Abc_Ntk_t * pNtk, char * pFileName, int fUseHost )
{
    FILE * pFile;
    Abc_Obj_t * pObj;
    int i;

//    assert( Abc_NtkIsSeq(pNtk)  );

    // start the output stream
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteList(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    fprintf( pFile, "# Adjacency list for sequential AIG \"%s\"\n", pNtk->pName );
    fprintf( pFile, "# written by ABC on %s\n", Extra_TimeStamp() );

    // write the constant node
    if ( Abc_ObjFanoutNum( Abc_AigConst1(pNtk) ) > 0 )
        Io_WriteListEdge( pFile, Abc_AigConst1(pNtk) );

    // write the PI edges
    Abc_NtkForEachPi( pNtk, pObj, i )
        Io_WriteListEdge( pFile, pObj );

    // write the internal nodes
    Abc_AigForEachAnd( pNtk, pObj, i )
        Io_WriteListEdge( pFile, pObj );

    // write the host node
    if ( fUseHost )
        Io_WriteListHost( pFile, pNtk );
    else
        Abc_NtkForEachPo( pNtk, pObj, i )
            Io_WriteListEdge( pFile, pObj );

    fprintf( pFile, "\n" );
    fclose( pFile );
}